

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

void cft_fasttext_vocab_free(fasttext_vocab_t *vocab)

{
  ulong uVar1;
  
  if (vocab != (fasttext_vocab_t *)0x0) {
    if (vocab->length != 0) {
      uVar1 = 0;
      do {
        free(vocab->words[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < vocab->length);
    }
    free(vocab->words);
    free(vocab->freqs);
    free(vocab);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_vocab_free(fasttext_vocab_t* vocab) {
    if (vocab == nullptr) {
        return;
    }
    for (size_t i = 0; i < vocab->length; i++) {
        free(vocab->words[i]);
    }
    free(vocab->words);
    free(vocab->freqs);
    free(vocab);
}